

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O2

bool absl::lts_20240722::str_format_internal::ConvertIntArg<absl::lts_20240722::uint128>
               (uint128 v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  bool bVar1;
  uint uVar2;
  IntDigits *as_digits_00;
  FormatSinkImpl *pFVar3;
  double v_00;
  FormatConversionSpecImpl conv_00;
  FormatConversionSpecImpl conv_01;
  string_view v_01;
  FormatConversionSpecImpl conv_02;
  IntDigits as_digits;
  IntDigits *local_78;
  uint local_70;
  uint128 local_68;
  IntDigits local_58;
  
  uVar2 = conv.precision_;
  as_digits_00 = conv._0_8_;
  local_68.hi_ = v.hi_;
  local_68.lo_ = v.lo_;
  conv_00.precision_ = (int)sink;
  pFVar3 = sink;
  local_78 = as_digits_00;
  local_70 = uVar2;
  switch((ulong)as_digits_00 & 0xff) {
  case 0:
    if ((conv._0_4_ & 0xff0000U) != 0x20000) {
      conv_02.precision_ = conv_00.precision_;
      conv_02._0_8_ = as_digits_00;
      anon_unknown_53::ConvertCharImpl
                ((char)v.lo_,conv_02,(FormatSinkImpl *)&switchD_0010d16e::switchdataD_00113400);
      return true;
    }
    conv_01.width_ = 0;
    conv_01.conv_ = (char)uVar2;
    conv_01.flags_ = (char)(uVar2 >> 8);
    conv_01.length_mod_ = (char)(uVar2 >> 0x10);
    conv_01._3_1_ = (char)(uVar2 >> 0x18);
    conv_01.precision_ = conv_00.precision_;
    bVar1 = anon_unknown_53::ConvertWCharTImpl
                      ((anon_unknown_53 *)(local_68.lo_ & 0xffffffff),conv._0_4_,conv_01,sink);
    return bVar1;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/absl-src/absl/strings/internal/str_format/arg.cc"
                  ,0x1c2,
                  "bool absl::str_format_internal::ConvertIntArg(T, FormatConversionSpecImpl, FormatSinkImpl *) [T = absl::uint128]"
                 );
  case 2:
  case 3:
  case 5:
  case 0x12:
    anon_unknown_53::IntDigits::PrintAsDec(&local_58,v,false);
    break;
  case 4:
    anon_unknown_53::IntDigits::PrintAsOct<absl::lts_20240722::uint128>(&local_58,v);
    break;
  case 6:
    anon_unknown_53::IntDigits::PrintAsHexLower<absl::lts_20240722::uint128>(&local_58,v);
    break;
  case 7:
    anon_unknown_53::IntDigits::PrintAsHexUpper<absl::lts_20240722::uint128>(&local_58,v);
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    v_00 = uint128::operator_cast_to_double(&local_68);
    bVar1 = ConvertFloatImpl(v_00,(FormatConversionSpecImpl *)&local_78,sink);
    return bVar1;
  }
  if (((undefined1  [12])conv & (undefined1  [12])0xff00) == (undefined1  [12])0x0) {
    v_01._M_str = local_58.start_;
    v_01._M_len = local_58.size_;
    FormatSinkImpl::Append(sink,v_01);
  }
  else {
    conv_00.width_ = 0;
    conv_00.conv_ = (char)uVar2;
    conv_00.flags_ = (char)(uVar2 >> 8);
    conv_00.length_mod_ = (char)(uVar2 >> 0x10);
    conv_00._3_1_ = (char)(uVar2 >> 0x18);
    anon_unknown_53::ConvertIntImplInnerSlow
              ((anon_unknown_53 *)&local_58,as_digits_00,conv_00,pFVar3);
  }
  return true;
}

Assistant:

bool ConvertIntArg(T v, FormatConversionSpecImpl conv, FormatSinkImpl *sink) {
  using U = typename MakeUnsigned<T>::type;
  IntDigits as_digits;

  // This odd casting is due to a bug in -Wswitch behavior in gcc49 which causes
  // it to complain about a switch/case type mismatch, even though both are
  // FormatConversionChar.  Likely this is because at this point
  // FormatConversionChar is declared, but not defined.
  switch (static_cast<uint8_t>(conv.conversion_char())) {
    case static_cast<uint8_t>(FormatConversionCharInternal::c):
      return (std::is_same<T, wchar_t>::value ||
              (conv.length_mod() == LengthMod::l))
                 ? ConvertWCharTImpl(static_cast<wchar_t>(v), conv, sink)
                 : ConvertCharImpl(static_cast<char>(v), conv, sink);

    case static_cast<uint8_t>(FormatConversionCharInternal::o):
      as_digits.PrintAsOct(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::x):
      as_digits.PrintAsHexLower(static_cast<U>(v));
      break;
    case static_cast<uint8_t>(FormatConversionCharInternal::X):
      as_digits.PrintAsHexUpper(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::u):
      as_digits.PrintAsDec(static_cast<U>(v));
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::d):
    case static_cast<uint8_t>(FormatConversionCharInternal::i):
    case static_cast<uint8_t>(FormatConversionCharInternal::v):
      as_digits.PrintAsDec(v);
      break;

    case static_cast<uint8_t>(FormatConversionCharInternal::a):
    case static_cast<uint8_t>(FormatConversionCharInternal::e):
    case static_cast<uint8_t>(FormatConversionCharInternal::f):
    case static_cast<uint8_t>(FormatConversionCharInternal::g):
    case static_cast<uint8_t>(FormatConversionCharInternal::A):
    case static_cast<uint8_t>(FormatConversionCharInternal::E):
    case static_cast<uint8_t>(FormatConversionCharInternal::F):
    case static_cast<uint8_t>(FormatConversionCharInternal::G):
      return ConvertFloatImpl(static_cast<double>(v), conv, sink);

    default:
      ABSL_ASSUME(false);
  }

  if (conv.is_basic()) {
    sink->Append(as_digits.with_neg_and_zero());
    return true;
  }
  return ConvertIntImplInnerSlow(as_digits, conv, sink);
}